

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

void absl::lts_20250127::anon_unknown_1::AppendNumberUnit(string *out,double n,DisplayUnit unit)

{
  char cVar1;
  string *psVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  char local_4a [2];
  long local_48;
  string *local_40;
  double local_38;
  
  iVar7 = 0xf;
  if (unit.prec < 0xf) {
    iVar7 = unit.prec;
  }
  local_38 = 0.0;
  dVar13 = modf(n,&local_38);
  dVar13 = round(dVar13 * unit.pow10);
  lVar12 = (long)dVar13;
  if ((long)local_38 != 0 || lVar12 != 0) {
    uVar10 = 0xffffffff;
    lVar6 = (long)local_38;
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      local_4a[uVar8 + 1] = (char)lVar6 + (char)(lVar6 / 10) * -10 + '0';
      uVar4 = lVar6 + 9;
      uVar9 = uVar8 - 1;
      uVar10 = uVar10 - 1;
      lVar6 = lVar6 / 10;
    } while (0x12 < uVar4);
    local_48 = (long)unit.prec;
    local_40 = out;
    if ((int)uVar9 + 1 < 2) {
      pcVar11 = local_4a + uVar8 + 1;
    }
    else {
      pcVar11 = local_4a + (uVar9 - uVar10) + 1;
      memset(pcVar11,0x30,uVar9 & 0xffffffff);
    }
    psVar2 = local_40;
    std::__cxx11::string::append((char *)local_40,(ulong)pcVar11);
    if (lVar12 != 0) {
      std::__cxx11::string::push_back((char)psVar2);
      uVar10 = iVar7 - 1;
      lVar6 = 0;
      do {
        lVar5 = lVar6;
        local_4a[lVar5 + 1] = (char)lVar12 + (char)(lVar12 / 10) * -10 + '0';
        uVar9 = lVar12 + 9;
        lVar6 = lVar5 + -1;
        uVar10 = uVar10 - 1;
        lVar12 = lVar12 / 10;
      } while (0x12 < uVar9);
      lVar12 = 0xf;
      if (local_48 < 0xf) {
        lVar12 = local_48;
      }
      if ((int)(lVar12 + lVar6) + 1 < 2) {
        pcVar11 = local_4a + lVar5 + 1;
      }
      else {
        pcVar11 = local_4a + (lVar6 - (ulong)uVar10) + 1;
        memset(pcVar11,0x30,lVar12 + lVar6 & 0xffffffff);
      }
      pcVar3 = local_4a + 1;
      do {
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + -1;
      } while (cVar1 == '0');
      std::__cxx11::string::append((char *)psVar2,(ulong)pcVar11);
    }
    std::__cxx11::string::append((char *)psVar2,(ulong)unit.abbr._M_str);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, double n, DisplayUnit unit) {
  constexpr int kBufferSize = std::numeric_limits<double>::digits10;
  const int prec = std::min(kBufferSize, unit.prec);
  char buf[kBufferSize];  // also large enough to hold integer part
  char* ep = buf + sizeof(buf);
  double d = 0;
  int64_t frac_part = std::round(std::modf(n, &d) * unit.pow10);
  int64_t int_part = d;
  if (int_part != 0 || frac_part != 0) {
    char* bp = Format64(ep, 0, int_part);  // always < 1000
    out->append(bp, static_cast<size_t>(ep - bp));
    if (frac_part != 0) {
      out->push_back('.');
      bp = Format64(ep, prec, frac_part);
      while (ep[-1] == '0') --ep;
      out->append(bp, static_cast<size_t>(ep - bp));
    }
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}